

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::OutOfLinePrintString<int>
               (BaseTextGenerator *generator,int *values)

{
  AlphaNum *a;
  string local_68;
  AlphaNum local_48;
  
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,*values);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)&local_48,a);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}